

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btIDebugDraw.h
# Opt level: O2

void __thiscall
btIDebugDraw::drawSpherePatch
          (btIDebugDraw *this,btVector3 *center,btVector3 *up,btVector3 *axis,btScalar radius,
          btScalar minTh,btScalar maxTh,btScalar minPs,btScalar maxPs,btVector3 *color,
          btScalar stepDegrees,bool drawCenter)

{
  btScalar *pbVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  int iVar5;
  btVector3 *pbVar6;
  ulong uVar7;
  int iVar8;
  btVector3 *pbVar9;
  undefined3 in_register_00000089;
  int iVar10;
  long lVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar15;
  undefined4 in_XMM1_Dc;
  undefined4 uVar16;
  undefined4 in_XMM1_Dd;
  undefined4 uVar17;
  float fVar18;
  btVector3 bVar19;
  bool local_a7f;
  bool local_a7e;
  btScalar radius_local;
  btVector3 *local_a60;
  btScalar local_a58;
  btVector3 *local_a48;
  float local_a3c;
  int local_a38;
  undefined4 local_a34;
  float local_a30;
  btScalar sth;
  undefined1 local_a28 [16];
  ulong local_a18;
  long local_a10;
  btVector3 *local_a08;
  btVector3 *local_a00;
  btVector3 *local_9f8;
  long local_9f0;
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  btVector3 arcStart;
  btVector3 local_9a8;
  btVector3 spole;
  btVector3 npole;
  btVector3 vA [74];
  btVector3 vB [74];
  
  local_a34 = CONCAT31(in_register_00000089,drawCenter);
  local_a28._0_4_ = minTh;
  radius_local = radius;
  local_a60 = color;
  local_a58 = maxTh;
  vA[0] = operator*(up,&radius_local);
  npole = operator+(center,vA);
  vA[0] = operator*(up,&radius_local);
  local_a48 = vA;
  local_a08 = center;
  spole = operator-(center,local_a48);
  fVar13 = stepDegrees * 0.017453292;
  local_a00 = up;
  local_9f8 = axis;
  bVar19 = btVector3::cross(up,axis);
  local_9d8._8_4_ = extraout_XMM0_Dc;
  local_9d8._0_8_ = bVar19.m_floats._0_8_;
  local_9d8._12_4_ = extraout_XMM0_Dd;
  local_9e8._8_4_ = in_XMM1_Dc;
  local_9e8._0_8_ = bVar19.m_floats._8_8_;
  local_9e8._12_4_ = in_XMM1_Dd;
  local_a3c = fVar13 + -1.5707964;
  if ((float)local_a28._0_4_ > -1.5707964) {
    local_a3c = (float)local_a28._0_4_;
  }
  fVar18 = 1.5707964 - fVar13;
  if (1.5707964 > local_a58) {
    fVar18 = local_a58;
  }
  local_a7f = fVar18 < local_a3c;
  if (local_a7f) {
    local_a3c = fVar13 + -1.5707964;
    fVar18 = 1.5707964 - fVar13;
  }
  local_a7e = local_a7f || 1.5707964 <= local_a58;
  local_a7f = local_a7f || (float)local_a28._0_4_ <= -1.5707964;
  fVar18 = fVar18 - local_a3c;
  uVar4 = (uint)(fVar18 / fVar13);
  local_a18 = (ulong)uVar4;
  if ((int)uVar4 < 2) {
    local_a18 = 1;
  }
  iVar5 = (int)local_a18;
  fVar15 = maxPs - minPs;
  bVar3 = minPs <= maxPs;
  if (maxPs < minPs) {
    minPs = fVar13 + -3.1415927;
    maxPs = 3.1415927;
  }
  uVar4 = (uint)((maxPs - minPs) / fVar13);
  uVar7 = 1;
  if (1 < (int)uVar4) {
    uVar7 = (ulong)uVar4;
  }
  local_a38 = iVar5 + 1;
  local_a10 = uVar7 * 0x10;
  local_9f0 = local_a10 + 0x10;
  iVar8 = 0;
  pbVar9 = vB;
  do {
    pbVar6 = pbVar9;
    if (iVar8 == local_a38) {
      return;
    }
    fVar13 = (float)iVar8 * (fVar18 / (float)iVar5) + local_a3c;
    uVar16 = 0;
    uVar17 = 0;
    local_a58 = radius_local;
    fVar14 = sinf(fVar13);
    sth = fVar14 * local_a58;
    local_a58 = radius_local;
    fVar13 = cosf(fVar13);
    fVar13 = fVar13 * local_a58;
    bVar12 = iVar8 == (int)local_a18;
    iVar10 = 0;
    for (lVar11 = 0; local_9f0 != lVar11; lVar11 = lVar11 + 0x10) {
      fVar14 = (float)iVar10 * ((maxPs - minPs) / (float)(int)uVar7) + minPs;
      local_a28._0_4_ = fVar14;
      local_a58 = sinf(fVar14);
      local_a30 = cosf((float)local_a28._0_4_);
      local_a30 = local_a30 * fVar13;
      local_9a8 = operator*(local_9f8,&local_a30);
      bVar19 = operator+(local_a08,&local_9a8);
      local_a28._8_4_ = extraout_XMM0_Dc_00;
      local_a28._0_8_ = bVar19.m_floats._0_8_;
      local_a28._12_4_ = extraout_XMM0_Dd_00;
      local_9c8._8_4_ = uVar16;
      local_9c8._0_8_ = bVar19.m_floats._8_8_;
      local_9c8._12_4_ = uVar17;
      bVar19 = operator*(local_a00,&sth);
      pbVar1 = (btScalar *)((long)pbVar6->m_floats + lVar11);
      fVar14 = local_a58 * fVar13;
      auVar2._4_4_ = fVar14 * (float)local_9d8._4_4_ + (float)local_a28._4_4_ + bVar19.m_floats[1];
      auVar2._0_4_ = fVar14 * (float)local_9d8._0_4_ + (float)local_a28._0_4_ + bVar19.m_floats[0];
      auVar2._8_4_ = (float)local_9e8._0_4_ * fVar14 + (float)local_9c8._0_4_ + bVar19.m_floats[2];
      auVar2._12_4_ = 0;
      *(undefined1 (*) [16])((long)pbVar6->m_floats + lVar11) = auVar2;
      if (iVar8 == 0) {
        pbVar9 = &spole;
        if (local_a7e) goto LAB_00121370;
      }
      else {
        pbVar9 = (btVector3 *)((long)local_a48->m_floats + lVar11);
LAB_00121370:
        (*this->_vptr_btIDebugDraw[4])(this,pbVar9,pbVar1,local_a60);
      }
      if (lVar11 == 0) {
        arcStart.m_floats[0] = *pbVar1;
        arcStart.m_floats[1] = pbVar1[1];
        arcStart.m_floats[2] = pbVar1[2];
        arcStart.m_floats[3] = pbVar1[3];
      }
      else {
        (*this->_vptr_btIDebugDraw[4])(this,(long)pbVar6[-1].m_floats + lVar11,pbVar1,local_a60);
      }
      if (local_a7f && bVar12) {
        (*this->_vptr_btIDebugDraw[4])(this,&npole,pbVar1,local_a60);
      }
      if ((char)local_a34 != '\0') {
        if (bVar3 && fVar15 < 6.2831855) {
          pbVar9 = local_a08;
          if ((lVar11 == 0 || local_a10 == lVar11) && (iVar8 == 0 || bVar12)) goto LAB_0012141f;
        }
        else {
          pbVar9 = &arcStart;
          if (local_a10 == lVar11) {
LAB_0012141f:
            (*this->_vptr_btIDebugDraw[4])(this,pbVar9,pbVar1,local_a60);
          }
        }
      }
      iVar10 = iVar10 + 1;
    }
    iVar8 = iVar8 + 1;
    pbVar9 = local_a48;
    local_a48 = pbVar6;
  } while( true );
}

Assistant:

virtual void drawSpherePatch(const btVector3& center, const btVector3& up, const btVector3& axis, btScalar radius, 
		btScalar minTh, btScalar maxTh, btScalar minPs, btScalar maxPs, const btVector3& color, btScalar stepDegrees = btScalar(10.f),bool drawCenter = true)
	{
		btVector3 vA[74];
		btVector3 vB[74];
		btVector3 *pvA = vA, *pvB = vB, *pT;
		btVector3 npole = center + up * radius;
		btVector3 spole = center - up * radius;
		btVector3 arcStart;
		btScalar step = stepDegrees * SIMD_RADS_PER_DEG;
		const btVector3& kv = up;
		const btVector3& iv = axis;
		btVector3 jv = kv.cross(iv);
		bool drawN = false;
		bool drawS = false;
		if(minTh <= -SIMD_HALF_PI)
		{
			minTh = -SIMD_HALF_PI + step;
			drawN = true;
		}
		if(maxTh >= SIMD_HALF_PI)
		{
			maxTh = SIMD_HALF_PI - step;
			drawS = true;
		}
		if(minTh > maxTh)
		{
			minTh = -SIMD_HALF_PI + step;
			maxTh =  SIMD_HALF_PI - step;
			drawN = drawS = true;
		}
		int n_hor = (int)((maxTh - minTh) / step) + 1;
		if(n_hor < 2) n_hor = 2;
		btScalar step_h = (maxTh - minTh) / btScalar(n_hor - 1);
		bool isClosed = false;
		if(minPs > maxPs)
		{
			minPs = -SIMD_PI + step;
			maxPs =  SIMD_PI;
			isClosed = true;
		}
		else if((maxPs - minPs) >= SIMD_PI * btScalar(2.f))
		{
			isClosed = true;
		}
		else
		{
			isClosed = false;
		}
		int n_vert = (int)((maxPs - minPs) / step) + 1;
		if(n_vert < 2) n_vert = 2;
		btScalar step_v = (maxPs - minPs) / btScalar(n_vert - 1);
		for(int i = 0; i < n_hor; i++)
		{
			btScalar th = minTh + btScalar(i) * step_h;
			btScalar sth = radius * btSin(th);
			btScalar cth = radius * btCos(th);
			for(int j = 0; j < n_vert; j++)
			{
				btScalar psi = minPs + btScalar(j) * step_v;
				btScalar sps = btSin(psi);
				btScalar cps = btCos(psi);
				pvB[j] = center + cth * cps * iv + cth * sps * jv + sth * kv;
				if(i)
				{
					drawLine(pvA[j], pvB[j], color);
				}
				else if(drawS)
				{
					drawLine(spole, pvB[j], color);
				}
				if(j)
				{
					drawLine(pvB[j-1], pvB[j], color);
				}
				else
				{
					arcStart = pvB[j];
				}
				if((i == (n_hor - 1)) && drawN)
				{
					drawLine(npole, pvB[j], color);
				}
				
				if (drawCenter)
				{
					if(isClosed)
					{
						if(j == (n_vert-1))
						{
							drawLine(arcStart, pvB[j], color);
						}
					}
					else
					{
						if(((!i) || (i == (n_hor-1))) && ((!j) || (j == (n_vert-1))))
						{
							drawLine(center, pvB[j], color);
						}
					}
				}
			}
			pT = pvA; pvA = pvB; pvB = pT;
		}
	}